

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constants.h
# Opt level: O2

bool __thiscall
spvtools::opt::analysis::ConstantEqual::operator()(ConstantEqual *this,Constant *c1,Constant *c2)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  long *plVar4;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__x;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__y;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
  *__x_00;
  vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
  *__y_00;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  long *plVar3;
  undefined4 extraout_var_00;
  
  if (c1->type_ == c2->type_) {
    iVar2 = (*c1->_vptr_Constant[0xd])(c1);
    plVar3 = (long *)CONCAT44(extraout_var,iVar2);
    if (plVar3 == (long *)0x0) {
      iVar2 = (*c1->_vptr_Constant[0x11])(c1);
      plVar3 = (long *)CONCAT44(extraout_var_01,iVar2);
      if (plVar3 == (long *)0x0) {
        iVar2 = (*c1->_vptr_Constant[0x16])(c1);
        if (CONCAT44(extraout_var_03,iVar2) != 0) {
          iVar2 = (*c2->_vptr_Constant[0x16])(c2);
          return CONCAT44(extraout_var_04,iVar2) != 0;
        }
        __assert_fail("false && \"Tried to compare two invalid Constant instances.\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/constants.h"
                      ,0x1ef,
                      "bool spvtools::opt::analysis::ConstantEqual::operator()(const Constant *, const Constant *) const"
                     );
      }
      iVar2 = (*c2->_vptr_Constant[0x11])(c2);
      plVar4 = (long *)CONCAT44(extraout_var_02,iVar2);
      if (plVar4 != (long *)0x0) {
        __x_00 = (vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
                  *)(**(code **)(*plVar3 + 0xc0))(plVar3);
        __y_00 = (vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
                  *)(**(code **)(*plVar4 + 0xc0))(plVar4);
        bVar1 = std::operator==(__x_00,__y_00);
        return bVar1;
      }
    }
    else {
      iVar2 = (*c2->_vptr_Constant[0xd])(c2);
      plVar4 = (long *)CONCAT44(extraout_var_00,iVar2);
      if (plVar4 != (long *)0x0) {
        __x = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
              (**(code **)(*plVar3 + 0xc0))(plVar3);
        __y = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
              (**(code **)(*plVar4 + 0xc0))(plVar4);
        bVar1 = std::operator==(__x,__y);
        return bVar1;
      }
    }
  }
  return false;
}

Assistant:

const Type* type() const { return type_; }